

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O1

int CfdCompressPubkey(void *handle,char *pubkey,char **output)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  Pubkey key;
  undefined1 local_80 [32];
  Pubkey local_60;
  Pubkey local_48;
  
  cfd::Initialize();
  if (output == (char **)0x0) {
    local_80._0_8_ = "cfdcapi_key.cpp";
    local_80._8_4_ = 0x4e7;
    local_80._16_8_ = "CfdCompressPubkey";
    cfd::core::logger::log<>((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"Failed to parameter. output is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_80,pubkey,(allocator *)&local_60);
    cfd::core::Pubkey::Pubkey(&local_48,(string *)local_80);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_);
    }
    cfd::core::Pubkey::Compress(&local_60,&local_48);
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_80,&local_60);
    pcVar2 = cfd::capi::CreateString((string *)local_80);
    *output = pcVar2;
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_);
    }
    if (local_60.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_80._0_8_ = "cfdcapi_key.cpp";
  local_80._8_4_ = 0x4ed;
  local_80._16_8_ = "CfdCompressPubkey";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"pubkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"Failed to parameter. pubkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCompressPubkey(void* handle, const char* pubkey, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    Pubkey key(pubkey);
    *output = CreateString(key.Compress().GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}